

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ilimit_w;
  int *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  BYTE *pBVar12;
  int iVar13;
  int *piVar14;
  uint uVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  U32 UVar19;
  BYTE *pBVar20;
  long lVar21;
  ulong uVar22;
  U32 UVar23;
  U32 UVar24;
  U32 UVar25;
  int *piVar26;
  U32 maxDistance;
  size_t ofbCandidate;
  int *local_a8;
  size_t local_68;
  int *local_60;
  BYTE *local_58;
  int *local_50;
  int *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  iEnd = (int *)((long)src + srcSize);
  local_50 = (int *)((long)src + (srcSize - 8));
  pBVar3 = (ms->window).base;
  pBVar4 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  local_58 = pBVar3 + uVar2;
  uVar9 = (ms->window).lowLimit;
  uVar15 = (ms->cParams).windowLog;
  uVar8 = (ms->cParams).minMatch;
  uVar18 = 6;
  if (uVar8 < 6) {
    uVar18 = uVar8;
  }
  uVar8 = 4;
  if (4 < uVar18) {
    uVar8 = uVar18;
  }
  UVar24 = *rep;
  UVar25 = rep[1];
  ms->lazySkipping = 0;
  piVar26 = (int *)((ulong)(local_58 == (BYTE *)src) + (long)src);
  local_a8 = (int *)src;
  local_40 = rep;
  if (piVar26 < local_50) {
    local_48 = (int *)(pBVar4 + uVar2);
    local_38 = pBVar4 + uVar9;
    uVar9 = 1 << ((byte)uVar15 & 0x1f);
    ilimit_w = iEnd + -8;
    do {
      iVar13 = ((int)piVar26 - (int)pBVar3) + 1;
      UVar23 = (ms->window).lowLimit;
      UVar19 = iVar13 - uVar9;
      if (iVar13 - UVar23 <= uVar9) {
        UVar19 = UVar23;
      }
      local_60 = (int *)((long)piVar26 + 1);
      if (ms->loadedDictEnd != 0) {
        UVar19 = UVar23;
      }
      uVar15 = iVar13 - UVar24;
      pBVar20 = pBVar3;
      if (uVar15 < uVar2) {
        pBVar20 = pBVar4;
      }
      bVar7 = true;
      if ((uVar2 - 1) - uVar15 < 3) {
        uVar16 = 0;
      }
      else if ((iVar13 - UVar19 < UVar24) || (*local_60 != *(int *)(pBVar20 + uVar15))) {
        uVar16 = 0;
      }
      else {
        piVar14 = iEnd;
        if (uVar15 < uVar2) {
          piVar14 = local_48;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar26 + 5),(BYTE *)((long)(pBVar20 + uVar15) + 4),
                            (BYTE *)iEnd,(BYTE *)piVar14,local_58);
        uVar16 = sVar10 + 4;
        bVar7 = false;
      }
      uVar22 = 1;
      piVar14 = local_60;
      UVar23 = UVar24;
      if (bVar7) {
        local_68 = 999999999;
        if (uVar8 == 6) {
          uVar11 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar26,(BYTE *)iEnd,&local_68);
        }
        else if (uVar8 == 5) {
          uVar11 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar26,(BYTE *)iEnd,&local_68);
        }
        else {
          uVar11 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar26,(BYTE *)iEnd,&local_68);
        }
        uVar22 = local_68;
        piVar14 = piVar26;
        if (uVar11 <= uVar16) {
          uVar11 = uVar16;
          uVar22 = 1;
          piVar14 = local_60;
        }
        uVar16 = uVar11;
        if (3 < uVar16) {
          if (3 < uVar22) {
            pcVar17 = (char *)((long)piVar14 + (3 - (long)(pBVar3 + uVar22)));
            pBVar12 = local_58;
            pBVar20 = pBVar3;
            if ((uint)pcVar17 < uVar2) {
              pBVar12 = local_38;
              pBVar20 = pBVar4;
            }
            if ((local_a8 < piVar14) &&
               (uVar11 = (ulong)pcVar17 & 0xffffffff, pBVar12 < pBVar20 + uVar11)) {
              pBVar20 = pBVar20 + uVar11;
              do {
                piVar26 = (int *)((long)piVar14 + -1);
                pBVar20 = pBVar20 + -1;
                if ((*(BYTE *)piVar26 != *pBVar20) ||
                   (uVar16 = uVar16 + 1, piVar14 = piVar26, piVar26 <= local_a8)) break;
              } while (pBVar12 < pBVar20);
            }
            UVar23 = (int)uVar22 - 3;
            UVar25 = UVar24;
          }
          goto LAB_006c7253;
        }
        uVar16 = (long)piVar26 - (long)local_a8;
        piVar26 = (int *)((long)piVar26 + (uVar16 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar16);
        piVar14 = local_50;
      }
      else {
LAB_006c7253:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_006c7720:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_006c76e2:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar11 = (long)piVar14 - (long)local_a8;
        pBVar20 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar20 + uVar11) {
LAB_006c775e:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar14) {
LAB_006c773f:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (ilimit_w < piVar14) {
          ZSTD_safecopyLiterals(pBVar20,(BYTE *)local_a8,(BYTE *)piVar14,(BYTE *)ilimit_w);
        }
        else {
          uVar6 = *(undefined8 *)(local_a8 + 2);
          *(undefined8 *)pBVar20 = *(undefined8 *)local_a8;
          *(undefined8 *)(pBVar20 + 8) = uVar6;
          if (0x10 < uVar11) {
            pBVar20 = seqStore->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar20 + 0x10 + (-0x10 - (long)(local_a8 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)(local_a8 + 6);
            *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(local_a8 + 4);
            *(undefined8 *)(pBVar20 + 0x18) = uVar6;
            if (0x20 < (long)uVar11) {
              lVar21 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_a8 + lVar21 + 0x20);
                uVar6 = puVar1[1];
                pBVar12 = pBVar20 + lVar21 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)local_a8 + lVar21 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                lVar21 = lVar21 + 0x20;
              } while (pBVar12 + 0x20 < pBVar20 + uVar11);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar11;
        if (0xffff < uVar11) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5 = seqStore->sequences;
        psVar5->litLength = (U16)uVar11;
        psVar5->offBase = (U32)uVar22;
        if (uVar16 < 3) {
LAB_006c7701:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar16 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_006c777d:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar5->mlBase = (U16)(uVar16 - 3);
        seqStore->sequences = psVar5 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar26 = (int *)((long)piVar14 + uVar16);
        piVar14 = local_50;
        local_a8 = piVar26;
        do {
          UVar24 = UVar23;
          if (piVar14 < piVar26) break;
          iVar13 = (int)piVar26 - (int)pBVar3;
          UVar24 = (ms->window).lowLimit;
          UVar19 = iVar13 - uVar9;
          if (iVar13 - UVar24 <= uVar9) {
            UVar19 = UVar24;
          }
          if (ms->loadedDictEnd != 0) {
            UVar19 = UVar24;
          }
          uVar15 = iVar13 - UVar25;
          pBVar20 = pBVar3;
          if (uVar15 < uVar2) {
            pBVar20 = pBVar4;
          }
          if ((((uVar2 - 1) - uVar15 < 3) || (iVar13 - UVar19 < UVar25)) ||
             (*piVar26 != *(int *)(pBVar20 + uVar15))) {
            bVar7 = false;
            UVar24 = UVar25;
          }
          else {
            piVar14 = iEnd;
            if (uVar15 < uVar2) {
              piVar14 = local_48;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar26 + 1),(BYTE *)((long)(pBVar20 + uVar15) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar14,local_58);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_006c7720;
            if (0x20000 < seqStore->maxNbLit) goto LAB_006c76e2;
            pBVar20 = seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < pBVar20) goto LAB_006c775e;
            if (iEnd < local_a8) goto LAB_006c773f;
            if (ilimit_w < local_a8) {
              ZSTD_safecopyLiterals(pBVar20,(BYTE *)local_a8,(BYTE *)local_a8,(BYTE *)ilimit_w);
            }
            else {
              uVar6 = *(undefined8 *)(local_a8 + 2);
              *(undefined8 *)pBVar20 = *(undefined8 *)local_a8;
              *(undefined8 *)(pBVar20 + 8) = uVar6;
            }
            psVar5 = seqStore->sequences;
            psVar5->litLength = 0;
            psVar5->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_006c7701;
            if (0xffff < sVar10 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_006c777d;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar5 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar5->mlBase = (U16)(sVar10 + 1);
            seqStore->sequences = psVar5 + 1;
            piVar26 = (int *)((long)piVar26 + sVar10 + 4);
            bVar7 = true;
            piVar14 = local_50;
            UVar24 = UVar23;
            UVar23 = UVar25;
            local_a8 = piVar26;
          }
          UVar25 = UVar24;
          UVar24 = UVar23;
        } while (bVar7);
      }
    } while (piVar26 < piVar14);
  }
  *local_40 = UVar24;
  local_40[1] = UVar25;
  return (long)iEnd - (long)local_a8;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0);
}